

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TreeBuilders.cpp
# Opt level: O0

bool __thiscall
Opcode::AABBTreeOfTrianglesBuilder::ComputeGlobalBox
          (AABBTreeOfTrianglesBuilder *this,udword *primitives,udword nb_prims,AABB *global_box)

{
  MeshInterface *pMVar1;
  int *piVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float local_1d4;
  float local_1d0;
  float local_1cc;
  float local_1bc;
  float local_1b8;
  float local_1b4;
  float local_1a4;
  float local_1a0;
  float local_19c;
  float local_18c;
  float local_188;
  float local_184;
  float local_174;
  float local_170;
  float local_16c;
  float local_15c;
  float local_158;
  float local_154;
  VertexPointers VP;
  undefined1 local_110 [8];
  Point Max;
  Point Min;
  AABB *global_box_local;
  udword *puStack_e8;
  udword nb_prims_local;
  udword *primitives_local;
  AABBTreeOfTrianglesBuilder *this_local;
  IndexedTriangle *T;
  
  if ((primitives == (udword *)0x0) || (nb_prims == 0)) {
    this_local._3_1_ = false;
  }
  else {
    Max.y = 3.4028235e+38;
    Max.z = 3.4028235e+38;
    Min.x = 3.4028235e+38;
    local_110._0_4_ = -3.4028235e+38;
    local_110._4_4_ = -3.4028235e+38;
    Max.x = -3.4028235e+38;
    global_box_local._4_4_ = nb_prims;
    puStack_e8 = primitives;
    while (global_box_local._4_4_ != 0) {
      pMVar1 = this->mIMesh;
      piVar2 = (int *)((long)pMVar1->mTris->mVRef + (ulong)(*puStack_e8 * pMVar1->mTriStride));
      pfVar3 = (float *)((long)&pMVar1->mVerts->x + (ulong)(*piVar2 * pMVar1->mVertexStride));
      pfVar4 = (float *)((long)&pMVar1->mVerts->x + (ulong)(piVar2[1] * pMVar1->mVertexStride));
      pfVar5 = (float *)((long)&pMVar1->mVerts->x + (ulong)(piVar2[2] * pMVar1->mVertexStride));
      if (*pfVar3 <= Max.y) {
        local_154 = *pfVar3;
      }
      else {
        local_154 = Max.y;
      }
      if (pfVar3[1] <= Max.z) {
        local_158 = pfVar3[1];
      }
      else {
        local_158 = Max.z;
      }
      if (pfVar3[2] <= Min.x) {
        local_15c = pfVar3[2];
      }
      else {
        local_15c = Min.x;
      }
      if (*pfVar4 <= local_154) {
        local_16c = *pfVar4;
      }
      else {
        local_16c = local_154;
      }
      if (pfVar4[1] <= local_158) {
        local_170 = pfVar4[1];
      }
      else {
        local_170 = local_158;
      }
      if (pfVar4[2] <= local_15c) {
        local_174 = pfVar4[2];
      }
      else {
        local_174 = local_15c;
      }
      if (*pfVar5 <= local_16c) {
        local_184 = *pfVar5;
      }
      else {
        local_184 = local_16c;
      }
      Max.y = local_184;
      if (pfVar5[1] <= local_170) {
        local_188 = pfVar5[1];
      }
      else {
        local_188 = local_170;
      }
      Max.z = local_188;
      if (pfVar5[2] <= local_174) {
        local_18c = pfVar5[2];
      }
      else {
        local_18c = local_174;
      }
      Min.x = local_18c;
      if ((float)local_110._0_4_ < *pfVar3 || (float)local_110._0_4_ == *pfVar3) {
        local_19c = *pfVar3;
      }
      else {
        local_19c = (float)local_110._0_4_;
      }
      if ((float)local_110._4_4_ < pfVar3[1] || (float)local_110._4_4_ == pfVar3[1]) {
        local_1a0 = pfVar3[1];
      }
      else {
        local_1a0 = (float)local_110._4_4_;
      }
      if (Max.x < pfVar3[2] || Max.x == pfVar3[2]) {
        local_1a4 = pfVar3[2];
      }
      else {
        local_1a4 = Max.x;
      }
      if (local_19c < *pfVar4 || local_19c == *pfVar4) {
        local_1b4 = *pfVar4;
      }
      else {
        local_1b4 = local_19c;
      }
      if (local_1a0 < pfVar4[1] || local_1a0 == pfVar4[1]) {
        local_1b8 = pfVar4[1];
      }
      else {
        local_1b8 = local_1a0;
      }
      if (local_1a4 < pfVar4[2] || local_1a4 == pfVar4[2]) {
        local_1bc = pfVar4[2];
      }
      else {
        local_1bc = local_1a4;
      }
      if (local_1b4 < *pfVar5 || local_1b4 == *pfVar5) {
        local_1cc = *pfVar5;
      }
      else {
        local_1cc = local_1b4;
      }
      local_110._0_4_ = local_1cc;
      if (local_1b8 < pfVar5[1] || local_1b8 == pfVar5[1]) {
        local_1d0 = pfVar5[1];
      }
      else {
        local_1d0 = local_1b8;
      }
      local_110._4_4_ = local_1d0;
      if (local_1bc < pfVar5[2] || local_1bc == pfVar5[2]) {
        local_1d4 = pfVar5[2];
      }
      else {
        local_1d4 = local_1bc;
      }
      Max.x = local_1d4;
      global_box_local._4_4_ = global_box_local._4_4_ - 1;
      puStack_e8 = puStack_e8 + 1;
    }
    IceMaths::AABB::SetMinMax(global_box,(Point *)&Max.y,(Point *)local_110);
    this_local._3_1_ = true;
  }
  return this_local._3_1_;
}

Assistant:

bool AABBTreeOfTrianglesBuilder::ComputeGlobalBox(const udword* primitives, udword nb_prims, AABB& global_box) const
{
	// Checkings
	if(!primitives || !nb_prims)	return false;

	// Initialize global box
	Point Min(MAX_FLOAT, MAX_FLOAT, MAX_FLOAT);
	Point Max(MIN_FLOAT, MIN_FLOAT, MIN_FLOAT);

	// Loop through triangles
	VertexPointers VP;
	while(nb_prims--)
	{
		// Get current triangle-vertices
		mIMesh->GetTriangle(VP, *primitives++);
		// Update global box
		Min.Min(*VP.Vertex[0]).Min(*VP.Vertex[1]).Min(*VP.Vertex[2]);
		Max.Max(*VP.Vertex[0]).Max(*VP.Vertex[1]).Max(*VP.Vertex[2]);
	}
	global_box.SetMinMax(Min, Max);
	return true;
}